

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * lua_setupvalue(lua_State *L,int idx,int n)

{
  char *pcVar1;
  char *name;
  GCobj *o;
  TValue *val;
  cTValue *f;
  int n_local;
  int idx_local;
  lua_State *L_local;
  GCobj *local_30;
  lua_State *local_28;
  char *local_20;
  GCobj *local_18;
  lua_State *local_10;
  
  f._0_4_ = n;
  f._4_4_ = idx;
  _n_local = L;
  val = index2adr(L,idx);
  pcVar1 = lj_debug_uvnamev(val,(int)f - 1,(TValue **)&o,(GCobj **)&name);
  if (pcVar1 != (char *)0x0) {
    _n_local->top = _n_local->top + -1;
    L_local = (lua_State *)_n_local->top;
    local_28 = _n_local;
    local_30 = o;
    (o->gch).nextgc.gcptr64 = (uint64_t)*(GCRef *)L_local;
    local_10 = _n_local;
    local_18 = o;
    local_20 = "copy of dead GC object";
    if (((0xfffffff6 < ((int)(_n_local->top->field_4).it >> 0xf) + 4U) &&
        ((*(byte *)((_n_local->top->u64 & 0x7fffffffffff) + 8) & 3) != 0)) && ((name[8] & 4U) != 0))
    {
      lj_gc_barrierf((global_State *)(_n_local->glref).ptr64,(GCobj *)name,
                     (GCobj *)(_n_local->top->u64 & 0x7fffffffffff));
    }
  }
  return pcVar1;
}

Assistant:

LUA_API const char *lua_setupvalue(lua_State *L, int idx, int n)
{
  cTValue *f = index2adr(L, idx);
  TValue *val;
  GCobj *o;
  const char *name;
  lj_checkapi_slot(1);
  name = lj_debug_uvnamev(f, (uint32_t)(n-1), &val, &o);
  if (name) {
    L->top--;
    copyTV(L, val, L->top);
    lj_gc_barrier(L, o, L->top);
  }
  return name;
}